

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::ComputeSolutionHDivT<double>
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZMaterialDataT<double> *data)

{
  double dVar1;
  double dVar2;
  int iVar3;
  TPZManVector<double,_10> *pTVar4;
  TPZFNMatrix<30,_double> *pTVar5;
  TNode *pTVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long *plVar11;
  TPZCompMesh *pTVar12;
  TPZFMatrix<double> *pTVar13;
  Fad<double> *pFVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int j;
  int iVar19;
  long lVar20;
  int ilinha;
  int i;
  TPZFMatrix<double> GradOfPhiHdiv;
  TPZFNMatrix<4,_double> Grad0;
  TPZFNMatrix<3,_double> Normalvec;
  TPZManVector<TPZFNMatrix<9,_double>,_18> GradNormalvec;
  long local_12d0;
  long local_12c0;
  long local_12b8;
  long local_1290;
  ulong local_1280;
  long local_1258;
  TPZFMatrix<double> local_1208;
  TPZManVector<double,_3> local_1178 [3];
  TPZFNMatrix<3,_double> local_10c0;
  TPZManVector<TPZFNMatrix<9,_double>,_18> local_1010;
  
  plVar11 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  uVar9 = (**(code **)(*plVar11 + 0x78))(plVar11);
  iVar10 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x90))(this);
  pTVar12 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar13 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar12->fSolution);
  if ((pTVar13->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol != 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x24e);
  }
  TPZManVector<TPZManVector<double,_10>,_20>::Resize(&data->sol,1);
  TPZManVector<TPZFNMatrix<30,_double>,_20>::Resize(&data->dsol,1);
  TPZManVector<TPZManVector<double,_10>,_20>::Resize(&data->divsol,1);
  lVar20 = 0;
  lVar17 = 0;
  lVar18 = 1;
  do {
    pTVar4 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
    (**(code **)(*(long *)((long)pTVar4->fExtAlloc + lVar17 + -0x20) + 0x18))
              ((long)pTVar4->fExtAlloc + lVar17 + -0x20,(long)(int)(uVar9 * 3));
    local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
               lVar17 + -0x20),(double *)&local_1010,0,-1);
    pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
    (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                   (&((TPZFMatrix<double> *)
                                     (&(pTVar5->super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1
                                   ))->fPivot + 0xffffffffffffffff) + lVar20) + 0x70))
              ((long)(&((TPZFMatrix<double> *)
                       (&((TPZFMatrix<double> *)(&(pTVar5->super_TPZFMatrix<double>).fPivot + -1))->
                         fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar20,(long)(int)(uVar9 * 3)
               ,3);
    pTVar4 = (data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
    (**(code **)(*(long *)((long)pTVar4->fExtAlloc + lVar17 + -0x20) + 0x18))
              ((long)pTVar4->fExtAlloc + lVar17 + -0x20,(long)(int)uVar9);
    local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
               lVar17 + -0x20),(double *)&local_1010,0,-1);
    lVar17 = lVar17 + 0x70;
    lVar20 = lVar20 + 0x188;
    lVar18 = lVar18 + -1;
  } while (lVar18 != 0);
  local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_1208.fElem = (double *)0x0;
  local_1208.fGiven = (double *)0x0;
  local_1208.fSize = 0;
  TPZVec<int>::TPZVec(&local_1208.fPivot.super_TPZVec<int>,0);
  local_1208.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1208.fPivot.super_TPZVec<int>.fStore = local_1208.fPivot.fExtAlloc;
  local_1208.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1208.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1208.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1208.fWork.fStore = (double *)0x0;
  local_1208.fWork.fNElements = 0;
  local_1208.fWork.fNAlloc = 0;
  local_1208.fElem = (double *)operator_new__(0x48);
  memset(local_1208.fElem,0,
         local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  lVar18 = (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                      super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
  TPZFNMatrix<3,_double>::TPZFNMatrix
            (&local_10c0,
             (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                        super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,lVar18,
             (double *)&local_1010);
  TPZManVector<TPZFNMatrix<9,_double>,_18>::TPZManVector(&local_1010,lVar18);
  if (0 < local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fNElements) {
    lVar18 = 0;
    lVar17 = 0;
    do {
      (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                     (&((TPZFMatrix<double> *)
                                       (&((local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)
                                         ->super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->
                                     fPivot + 0xffffffffffffffff) + lVar18) + 0x70))
                ((long)(&((TPZFMatrix<double> *)
                         (&((TPZFMatrix<double> *)
                           (&((local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)->
                             super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->fPivot +
                       0xffffffffffffffff) + lVar18,3,3);
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0xe0;
    } while (lVar17 < local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fNElements);
  }
  if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad != false) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x26c);
  }
  TPZFMatrix<double>::operator=
            (&local_10c0.super_TPZFMatrix<double>,
             &(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>);
  pTVar12 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (0 < iVar10) {
    iVar19 = 0;
    local_1290 = 0;
    local_12c0 = 0;
    local_12d0 = 0;
    do {
      lVar18 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar19);
      pTVar6 = (pTVar12->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      uVar8 = (long)pTVar6[*(int *)(lVar18 + 8)].dim / (long)(int)uVar9;
      if (0 < (int)uVar8) {
        iVar3 = pTVar6[*(int *)(lVar18 + 8)].pos;
        local_1290 = (long)(int)local_1290;
        local_12c0 = (long)(int)local_12c0;
        local_12d0 = (long)(int)local_12d0;
        local_1258 = local_12c0 * 8;
        local_1280 = 0;
        do {
          local_12b8 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar16 = 0;
              do {
                lVar18 = local_1280 * (long)(int)uVar9 + (long)iVar3 + uVar16;
                if (((lVar18 < 0) ||
                    ((pTVar13->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar18)) ||
                   ((pTVar13->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_12b8)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar1 = pTVar13->fElem
                        [(pTVar13->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_12b8 +
                         lVar18];
                if (((local_12d0 < 0) ||
                    ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                     super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= local_12d0)) ||
                   ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                    super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar2 = (data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.fElem[local_12d0]
                ;
                TPZManVector<double,_3>::TPZManVector(local_1178,3);
                lVar18 = 0;
                lVar17 = 0;
                do {
                  if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                    if ((((data->super_TPZMaterialData).fDeformedDirectionsFad.
                          super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar17) ||
                        (local_12c0 < 0)) ||
                       ((data->super_TPZMaterialData).fDeformedDirectionsFad.
                        super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= local_12c0)) {
                      TPZFMatrix<Fad<double>_>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    pFVar14 = (data->super_TPZMaterialData).fDeformedDirectionsFad.fElem +
                              (data->super_TPZMaterialData).fDeformedDirectionsFad.
                              super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * local_12c0 +
                              lVar17;
                  }
                  else {
                    if ((((data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>
                          .super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
                        (local_12c0 < 0)) ||
                       ((data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                        super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= local_12c0)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    pFVar14 = (Fad<double> *)
                              ((long)(data->super_TPZMaterialData).fDeformedDirections.
                                     super_TPZFMatrix<double>.fElem +
                              lVar18 + (data->super_TPZMaterialData).fDeformedDirections.
                                       super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                       super_TPZBaseMatrix.fRow * local_1258);
                  }
                  *(double *)((long)local_1178[0].super_TPZVec<double>.fStore + lVar18) =
                       pFVar14->val_;
                  lVar17 = lVar17 + 1;
                  lVar18 = lVar18 + 8;
                } while (lVar17 != 3);
                if (((local_1290 < 0) ||
                    ((data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>.
                     super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= local_1290)) ||
                   ((data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>.
                    super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar7 = (data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore[local_12b8].
                         super_TPZVec<double>.fStore;
                pdVar7[uVar16] =
                     (data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>.fElem[local_1290]
                     * dVar1 + pdVar7[uVar16];
                lVar18 = 0;
                do {
                  lVar17 = lVar18 + uVar16 * 3;
                  pdVar7 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore[local_12b8].
                           super_TPZVec<double>.fStore;
                  pdVar7[lVar17] =
                       local_1178[0].super_TPZVec<double>.fStore[lVar18] * dVar2 * dVar1 +
                       pdVar7[lVar17];
                  lVar20 = 0;
                  do {
                    if ((local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
                       (local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar20)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
                    if ((pTVar5[local_12b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                         super_TPZBaseMatrix.fRow <= lVar17) ||
                       (pTVar5[local_12b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fCol <= lVar20)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    lVar15 = pTVar5[local_12b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow * lVar20;
                    pdVar7 = pTVar5[local_12b8].super_TPZFMatrix<double>.fElem;
                    pdVar7[lVar15 + lVar17] =
                         local_1208.fElem
                         [local_1208.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar20 +
                          lVar18] * dVar1 + pdVar7[lVar15 + lVar17];
                    if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                      if ((local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore[local_12c0].
                           super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
                           <= lVar18) ||
                         (local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore[local_12c0].
                          super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
                          <= lVar20)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      if (((local_12d0 < 0) ||
                          ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                           super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= local_12d0)) ||
                         ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.
                          super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
                      if ((pTVar5[local_12b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= lVar17) ||
                         (pTVar5[local_12b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= lVar20)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      lVar15 = pTVar5[local_12b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow * lVar20;
                      pdVar7 = pTVar5[local_12b8].super_TPZFMatrix<double>.fElem;
                      pdVar7[lVar15 + lVar17] =
                           local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore[local_12c0].
                           super_TPZFMatrix<double>.fElem
                           [local_1010.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore[local_12c0].
                            super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                            fRow * lVar20 + lVar18] * dVar1 *
                           (data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.fElem
                           [local_12d0] + pdVar7[lVar15 + lVar17];
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 3);
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                TPZManVector<double,_3>::~TPZManVector(local_1178);
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar9);
            }
            local_12b8 = local_12b8 + 1;
          } while (local_12b8 != 1);
          local_1290 = local_1290 + 1;
          local_12c0 = local_12c0 + 1;
          local_12d0 = local_12d0 + 1;
          local_1280 = local_1280 + 1;
          local_1258 = local_1258 + 8;
        } while (local_1280 != (uVar8 & 0xffffffff));
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar10);
  }
  TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector(&local_1010);
  TPZFMatrix<double>::~TPZFMatrix(&local_10c0.super_TPZFMatrix<double>,&PTR_PTR_0186cdf0);
  TPZFMatrix<double>::~TPZFMatrix(&local_1208);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeSolutionHDivT(TPZMaterialDataT<TVar> &data)
{
    
    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }


    TPZFMatrix<TVar> GradOfPhiHdiv(dim,dim);
    GradOfPhiHdiv.Zero();


    int normvecRows = data.fDeformedDirections.Rows();
    int normvecCols = data.fDeformedDirections.Cols();
    TPZFNMatrix<3,REAL> Normalvec(normvecRows,normvecCols,0.);
    TPZManVector<TPZFNMatrix<9,REAL>,18> GradNormalvec(normvecCols);
    for (int i=0; i<GradNormalvec.size(); i++) {
        GradNormalvec[i].Redim(dim,dim);
    }

    if (data.fNeedsDeformedDirectionsFad) {
        // Needs to be rethought
        DebugStop();
        for (int e = 0; e < normvecRows; e++) {
            for (int s = 0; s < normvecCols; s++) {
                Normalvec(e,s)=data.fDeformedDirectionsFad(e,s).val();
            }
        }

        TPZFNMatrix<4,REAL> Grad0(3,3,0.);
        TPZGeoEl *ref = this->Reference();
        const int gel_dim = ref->Dimension();

        for (int s = 0; s < normvecCols; s++) {
            for (int i = 0; i < gel_dim; i++) {
                for (int j = 0; j < gel_dim; j++) {
                    Grad0(i,j)=data.fDeformedDirectionsFad(i,s).fastAccessDx(j);
                }
            }
            GradNormalvec[s] = Grad0;
        }

    }else{
        Normalvec=data.fDeformedDirections;
    }

    TPZBlock &block =this->Mesh()->Block();
    int ishape=0,ivec=0,counter=0;

    int nshapeV = data.fVecShapeIndex.NElements();

    for(int in=0; in<ncon; in++)
    {
        TPZConnect *df = &this->Connect(in);
        int64_t dfseq = df->SequenceNumber();
        int dfvar = block.Size(dfseq);
        // pos : position of the block in the solution matrix
        int64_t pos = block.Position(dfseq);

        /// ish loops of the number of shape functions associated with the block
        for(int ish=0; ish<dfvar/nstate; ish++)
        {
            for (int64_t is=0; is<numbersol; is++)
            {
                for(int idf=0; idf<nstate; idf++)
                {
                    TVar meshsol = MeshSol(pos+ish*nstate+idf,is);
                    REAL phival = data.phi(ishape,0);
                    TPZManVector<REAL,3> normal(3);

                    for (int i=0; i<3; i++)
                    {
                        if (data.fNeedsDeformedDirectionsFad) {
                            normal[i] = data.fDeformedDirectionsFad(i,ivec).val();
                        }else{
                            normal[i] = data.fDeformedDirections(i,ivec);
                        }
                    }

#ifdef PZ_LOG
                    if(logger.isDebugEnabled() && abs(meshsol) > 1.e-6)
                    {
                        std::stringstream sout;
                        sout << "meshsol = " << meshsol << " ivec " << ivec << " ishape " << ishape << " x " << data.x << std::endl;
                        sout << " phi = " << data.phi(ishape,0)  << std::endl;
                        sout << "normal = " << normal << std::endl;
//                        sout << "GradOfPhiHdiv " << GradOfPhiHdiv << std::endl;
                        sout << "GradNormalVec " << GradNormalvec[ivec] << std::endl;
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif

                    data.divsol[is][idf] += data.divphi(counter,0)*meshsol;
                    for (int ilinha=0; ilinha<dim; ilinha++) {
                        data.sol[is][ilinha+dim*idf] += normal[ilinha]*phival*meshsol;
                        for (int kdim = 0 ; kdim < dim; kdim++) {
                            data.dsol[is](ilinha+dim*idf,kdim)+= meshsol * GradOfPhiHdiv(ilinha,kdim);
                            if(data.fNeedsDeformedDirectionsFad){
                                data.dsol[is](ilinha+dim*idf,kdim)+=meshsol *GradNormalvec[ivec](ilinha,kdim)*data.phi(ishape,0);
                            }
                        }

                    }

                }
            }
            counter++;
            ivec++;
            ishape++;
        }
    }






#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "x " << data.x << " sol " << data.sol[0] << std::endl;
        data.dsol[0].Print("dsol",sout);
        sout << "divsol" << data.divsol[0] << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif

}